

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall
iqnet::Reactor<boost::mutex>::invoke_servers_handler
          (Reactor<boost::mutex> *this,Event_handler *handler,HandlerState *hs,bool *terminate)

{
  invoke_clients_handler(this,handler,hs,terminate);
  return;
}

Assistant:

void Reactor<Lock>::invoke_servers_handler(
    Event_handler* handler, HandlerState& hs, bool& terminate )
{
  try {
    invoke_clients_handler( handler, hs, terminate );
  }
  catch( const std::exception& e )
  {
    handler->log_exception( e );
    terminate = true;
  }
  catch( ... )
  {
    handler->log_unknown_exception();
    terminate = true;
  }
}